

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemSizeCalculator.cpp
# Opt level: O2

int __thiscall MemSizeCalculator::calculateVariable(MemSizeCalculator *this,Variable *variable)

{
  SymbolTable *this_00;
  bool bVar1;
  int _size;
  Class *_class;
  vector<int,_std::allocator<int>_> *pvVar2;
  int *piVar3;
  string sStack_48;
  
  bVar1 = Variable::isTypeId(variable);
  if (bVar1) {
    this_00 = this->symbolTable;
    Variable::getRawType_abi_cxx11_(&sStack_48,variable);
    _class = Semantic::SymbolTable::getClass(this_00,&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
    if (_class->isMemSizeAlreadyCalculated == true) {
      _size = Class::getSize(_class);
    }
    else {
      _size = calculateClass(this,_class);
    }
  }
  else {
    if (variable->dimensions == 0) {
      _size = 4;
    }
    else {
      pvVar2 = Variable::getArraySize(variable);
      _size = 4;
      for (piVar3 = (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          piVar3 != (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish; piVar3 = piVar3 + 1) {
        _size = _size * *piVar3;
      }
    }
    Variable::setSize(variable,_size);
  }
  return _size;
}

Assistant:

int MemSizeCalculator::calculateVariable(Variable *variable) {
    if (variable->isTypeId()) {
        auto classToCalculate = symbolTable->getClass(variable->getRawType());
        if (classToCalculate->isMemSizeAlreadyCalculated) return classToCalculate->getSize();
        else { return calculateClass(classToCalculate); }
    }
    int size = 4;
    if (variable->isArray())
        for (int _size : variable->getArraySize()) size *= _size;
    variable->setSize(size);
    return size;
}